

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_append_columns(fitsfile *ff,NGP_HDU *ngph,int aftercol)

{
  int iVar1;
  uint in_EDX;
  int *in_RSI;
  long in_RDI;
  char ngph_ctmp;
  char *my_ttype;
  char *my_tform;
  int ngph_i;
  int exitflg;
  int j;
  int i;
  int r;
  undefined1 local_41;
  char *status;
  char *tform;
  int in_stack_ffffffffffffffd0;
  int iVar2;
  uint local_28;
  int numcol;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 0x16a;
  }
  else if (in_RSI == (int *)0x0) {
    local_4 = 0x16a;
  }
  else if (*in_RSI == 0) {
    local_4 = 0;
  }
  else {
    local_4 = 0;
    iVar2 = 0;
    for (local_28 = in_EDX; (int)local_28 < 999; local_28 = local_28 + 1) {
      tform = (char *)0x0;
      status = "";
      numcol = 0;
      while( true ) {
        iVar1 = __isoc99_sscanf(*(long *)(in_RSI + 2) + (long)numcol * 0xb0 + 4,"TFORM%d%c",
                                &stack0xffffffffffffffd0,&local_41);
        if (iVar1 == 1) {
          if ((*(int *)(*(long *)(in_RSI + 2) + (long)numcol * 0xb0) == 2) &&
             (in_stack_ffffffffffffffd0 == local_28 + 1)) {
            tform = *(char **)(*(long *)(in_RSI + 2) + (long)numcol * 0xb0 + 0x50);
          }
        }
        else {
          iVar1 = __isoc99_sscanf(*(long *)(in_RSI + 2) + (long)numcol * 0xb0 + 4,"TTYPE%d%c",
                                  &stack0xffffffffffffffd0,&local_41);
          if (((iVar1 == 1) && (*(int *)(*(long *)(in_RSI + 2) + (long)numcol * 0xb0) == 2)) &&
             (in_stack_ffffffffffffffd0 == local_28 + 1)) {
            status = *(char **)(*(long *)(in_RSI + 2) + (long)numcol * 0xb0 + 0x50);
          }
        }
        if ((tform != (char *)0x0) && ((char)*(int *)status != '\0')) goto LAB_001dbe58;
        if (*in_RSI + -1 <= numcol) break;
        numcol = numcol + 1;
      }
      iVar2 = 1;
LAB_001dbe58:
      if ((local_4 == 0) && (tform != (char *)0x0)) {
        fficol((fitsfile *)((ulong)in_EDX << 0x20),numcol,
               (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),tform,(int *)status);
      }
      if (local_4 != 0) {
        return local_4;
      }
      if (iVar2 != 0) {
        return 0;
      }
    }
  }
  return local_4;
}

Assistant:

int	ngp_append_columns(fitsfile *ff, NGP_HDU *ngph, int aftercol)
 { int		r, i, j, exitflg, ngph_i;
   char 	*my_tform, *my_ttype;
   char		ngph_ctmp;


   if (NULL == ff) return(NGP_NUL_PTR);
   if (NULL == ngph) return(NGP_NUL_PTR);
   if (0 == ngph->tokcnt) return(NGP_OK);	/* nothing to do ! */

   r = NGP_OK;
   exitflg = 0;

   for (j=aftercol; j<NGP_MAX_ARRAY_DIM; j++)	/* 0 for table, 6 for group */
    { 
      my_tform = NULL;
      my_ttype = "";
    
      for (i=0; ; i++)
       { if (1 == sscanf(ngph->tok[i].name, "TFORM%d%c", &ngph_i, &ngph_ctmp))
           { if ((NGP_TTYPE_STRING == ngph->tok[i].type) && (ngph_i == (j + 1)))
   	    { my_tform = ngph->tok[i].value.s;
   	    }
                }
         else if (1 == sscanf(ngph->tok[i].name, "TTYPE%d%c", &ngph_i, &ngph_ctmp))
           { if ((NGP_TTYPE_STRING == ngph->tok[i].type) && (ngph_i == (j + 1)))
               { my_ttype = ngph->tok[i].value.s;
               }
           }
         
         if ((NULL != my_tform) && (my_ttype[0])) break;
         
         if (i < (ngph->tokcnt - 1)) continue;
         exitflg = 1;
         break;
       }
      if ((NGP_OK == r) && (NULL != my_tform))
        fits_insert_col(ff, j + 1, my_ttype, my_tform, &r);

      if ((NGP_OK != r) || exitflg) break;
    }
   return(r);
 }